

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O2

void sequence_iterator_duplicate_test(void)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  void *pvVar3;
  fdb_status fVar4;
  int iVar5;
  size_t sVar6;
  size_t metalen;
  size_t bodylen;
  ulong uVar7;
  fdb_doc **doc;
  int iVar8;
  char *pcVar9;
  fdb_doc *doc_00;
  uint uVar10;
  long lVar11;
  fdb_kvs_handle *db;
  fdb_doc *rdoc;
  fdb_file_handle *dbfile;
  fdb_iterator *iterator;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char bodybuf [256];
  fdb_doc *local_648 [100];
  char metabuf [256];
  char keybuf [256];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.buffercache_size = 0;
  fconfig.seqtree_opt = '\x01';
  fconfig.wal_threshold = 0x400;
  fconfig.compaction_threshold = '\0';
  fconfig.purging_interval = 1;
  fdb_open(&dbfile,"./iterator_test1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  fVar4 = fdb_set_log_callback(db,logCallbackFunc,"sequence_iterator_test");
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x8c5);
    sequence_iterator_duplicate_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x8c5,"void sequence_iterator_duplicate_test()");
  }
  lVar11 = 0;
  for (uVar7 = 0; uVar7 != 100; uVar7 = uVar7 + 1) {
    sprintf(keybuf,"key%d",uVar7 & 0xffffffff);
    sprintf(metabuf,"meta%d",uVar7 & 0xffffffff);
    sprintf(bodybuf,"body%d(first)",uVar7 & 0xffffffff);
    sVar6 = strlen(keybuf);
    metalen = strlen(metabuf);
    bodylen = strlen(bodybuf);
    fdb_doc_create((fdb_doc **)((long)local_648 + lVar11),keybuf,sVar6,metabuf,metalen,bodybuf,
                   bodylen);
    fdb_set(db,local_648[uVar7]);
    lVar11 = lVar11 + 8;
  }
  fdb_commit(dbfile,'\x01');
  lVar11 = 0;
  for (uVar7 = 0; uVar7 != 100; uVar7 = uVar7 + 1) {
    sprintf(bodybuf,"body%d(second)",uVar7 & 0xffffffff);
    sVar6 = strlen(bodybuf);
    fdb_doc_update((fdb_doc **)((long)local_648 + lVar11),(void *)0x0,0,bodybuf,sVar6);
    fdb_set(db,local_648[uVar7]);
    lVar11 = lVar11 + 8;
  }
  fdb_commit(dbfile,'\x01');
  doc = local_648;
  for (uVar7 = 0; uVar7 < 100; uVar7 = uVar7 + 2) {
    sprintf(bodybuf,"body%d(third)",uVar7 & 0xffffffff);
    sVar6 = strlen(bodybuf);
    fdb_doc_update(doc,(void *)0x0,0,bodybuf,sVar6);
    fdb_set(db,*doc);
    doc = doc + 2;
  }
  fdb_commit(dbfile,'\0');
  fdb_iterator_sequence_init(db,&iterator,0,0xdc,0);
  uVar7 = 100;
  iVar8 = 100;
  while( true ) {
    fVar4 = fdb_iterator_get(iterator,&rdoc);
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x8ed);
      sequence_iterator_duplicate_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x8ed,"void sequence_iterator_duplicate_test()");
    }
    uVar7 = uVar7 + 1 + (ulong)(uVar7 < 0x8c);
    if (uVar7 < 0xc9) {
      uVar10 = (int)uVar7 - 0x65;
      pcVar9 = "body%d(second)";
    }
    else {
      uVar10 = (int)((uVar7 - 0x65) % 100) * 2;
      pcVar9 = "body%d(third)";
    }
    sprintf(bodybuf,pcVar9,(ulong)uVar10);
    doc_00 = rdoc;
    pvVar1 = rdoc->key;
    pfVar2 = local_648[(int)uVar10];
    pvVar3 = pfVar2->key;
    iVar5 = bcmp(pvVar1,pvVar3,rdoc->keylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x8fb);
      sequence_iterator_duplicate_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x8fb,"void sequence_iterator_duplicate_test()");
    }
    pvVar1 = doc_00->meta;
    pvVar3 = pfVar2->meta;
    iVar5 = bcmp(pvVar1,pvVar3,doc_00->metalen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x8fc);
      sequence_iterator_duplicate_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x8fc,"void sequence_iterator_duplicate_test()");
    }
    pvVar1 = doc_00->body;
    iVar5 = bcmp(pvVar1,bodybuf,doc_00->bodylen);
    if (iVar5 != 0) break;
    if (doc_00->seqnum != uVar7) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x8fe);
      sequence_iterator_duplicate_test()::__test_pass = '\x01';
      doc_00 = rdoc;
      if (rdoc->seqnum != uVar7) {
        __assert_fail("rdoc->seqnum == seqnum",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x8fe,"void sequence_iterator_duplicate_test()");
      }
    }
    fdb_doc_free(doc_00);
    rdoc = (fdb_doc *)0x0;
    fVar4 = fdb_iterator_next(iterator);
    iVar8 = iVar8 + -1;
    if (fVar4 == FDB_RESULT_ITERATOR_FAIL) {
      if (iVar8 == 0) {
        fdb_iterator_close(iterator);
        fdb_kvs_close(db);
        fdb_close(dbfile);
        for (lVar11 = 0; lVar11 != 100; lVar11 = lVar11 + 1) {
          fdb_doc_free(local_648[lVar11]);
        }
        fdb_shutdown();
        memleak_end();
        pcVar9 = "%s PASSED\n";
        if (sequence_iterator_duplicate_test()::__test_pass != '\0') {
          pcVar9 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar9,"sequence iterator duplicate test");
        return;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x904);
      sequence_iterator_duplicate_test()::__test_pass = 1;
      __assert_fail("count==n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x904,"void sequence_iterator_duplicate_test()");
    }
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodybuf,pvVar1,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0x8fd);
  sequence_iterator_duplicate_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x8fd,"void sequence_iterator_duplicate_test()");
}

Assistant:

void sequence_iterator_duplicate_test()
{
    // Unit test for MB-12225
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 100;
    int count;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;
    fdb_seqnum_t seqnum;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.wal_threshold = 1024;
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 1; // retain deletes until compaction

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "sequence_iterator_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents first time
    for (i=0;i<n;i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d(first)", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents second time
    for (i=0;i<n;i++){
        sprintf(bodybuf, "body%d(second)", i);
        fdb_doc_update(&doc[i], NULL, 0, bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents third time (only even number documents)
    for (i=0;i<n;i+=2){
        sprintf(bodybuf, "body%d(third)", i);
        fdb_doc_update(&doc[i], NULL, 0, bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // commit without WAL flushing
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // create an iterator over sequence number
    fdb_iterator_sequence_init(db, &iterator, 0, 220, FDB_ITR_NONE);

    // repeat until fail
    count = 0;
    seqnum = 100;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if (seqnum < 140) { // point where WAL range & trie range overlap ends!
            seqnum += 2; // WAL overlap with trie, get unique trie keys only
        } else { // beyond this even keys in trie are also in WAL but outside..
            seqnum ++; // the iteration range, so they can be sequentially got
        }

        if (seqnum <= 200) { // uptil WAL, unique trie items are returned...
            i = seqnum - 101;
            sprintf(bodybuf, "body%d(second)", i);
        } else { // once seqnum enters WAL range only WAL elements are returned..
            i = ((seqnum - 101) % n) * 2;
            sprintf(bodybuf, "body%d(third)", i);
        }
        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
        TEST_CHK(rdoc->seqnum == seqnum);

        count++;
        fdb_doc_free(rdoc);
        rdoc = NULL;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(count==n); // since 220 > n all keys should be iterated
    fdb_iterator_close(iterator);

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);
    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }
    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("sequence iterator duplicate test");
}